

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O0

void walk_binary_expr(CompilerState *compiler_state,AstNode *node,AstNodeList **expr_list)

{
  AstNode *node_00;
  AstNode *node_01;
  AstNode *right;
  AstNode *left;
  AstNodeList **expr_list_local;
  AstNode *node_local;
  CompilerState *compiler_state_local;
  
  if ((node->type == EXPR_BINARY) && ((node->field_2).unary_expr.unary_op == 0xc)) {
    node_00 = (node->field_2).function_stmt.function_expr;
    node_01 = (node->field_2).binary_expr.expr_right;
    if ((node_00->type == EXPR_BINARY) && ((node_00->field_2).unary_expr.unary_op == 0xc)) {
      walk_binary_expr(compiler_state,node_00,expr_list);
    }
    else {
      raviX_ptrlist_add((PtrList **)expr_list,node_00,compiler_state->allocator);
    }
    if ((node_01->type == EXPR_BINARY) && ((node_01->field_2).unary_expr.unary_op == 0xc)) {
      walk_binary_expr(compiler_state,node_01,expr_list);
    }
    else {
      raviX_ptrlist_add((PtrList **)expr_list,node_01,compiler_state->allocator);
    }
    return;
  }
  __assert_fail("node->type == EXPR_BINARY && node->binary_expr.binary_op == BINOPR_CONCAT",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_simplify.c"
                ,0x173,"void walk_binary_expr(CompilerState *, AstNode *, AstNodeList **)");
}

Assistant:

static void walk_binary_expr(CompilerState *compiler_state, AstNode *node, AstNodeList **expr_list) {
	assert(node->type == EXPR_BINARY && node->binary_expr.binary_op == BINOPR_CONCAT);
	AstNode *left = node->binary_expr.expr_left;
	AstNode *right = node->binary_expr.expr_right;
	if (left->type == EXPR_BINARY && left->binary_expr.binary_op == BINOPR_CONCAT) {
		walk_binary_expr(compiler_state, left, expr_list);
	} else {
		raviX_ptrlist_add((PtrList **)expr_list, left, compiler_state->allocator);
	}
	if (right->type == EXPR_BINARY && right->binary_expr.binary_op == BINOPR_CONCAT) {
		walk_binary_expr(compiler_state, right, expr_list);
	} else {
		raviX_ptrlist_add((PtrList **)expr_list, right, compiler_state->allocator);
	}
}